

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O0

bool simplejson_wcsnlen(wchar_t *s,size_t n)

{
  wchar_t wVar1;
  wchar_t *save;
  size_t n_local;
  wchar_t *s_local;
  
  save = s;
  n_local = n;
  if (s != (wchar_t *)0x0) {
    do {
      if (n_local == 0) {
        return true;
      }
      wVar1 = *save;
      save = save + 1;
      n_local = n_local - 1;
    } while (wVar1 != L'\0');
  }
  return false;
}

Assistant:

static inline bool simplejson_wcsnlen(const wchar_t *s, size_t n) {
	if (s == 0)
		return false;

	const wchar_t *save = s;
	while (n-- > 0)
	{
		if (*(save++) == 0) return false;
	}

	return true;
}